

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

void Cec_ManSimProcessRefined(Cec_ManSim_t *p,Vec_Int_t *vRefined)

{
  int nWords;
  Gia_Rpr_t GVar1;
  uint *puVar2;
  Gia_Man_t *pGVar3;
  Gia_Rpr_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  void *__ptr;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint nTableSize;
  long lVar11;
  
  if (vRefined->nSize != 0) {
    uVar10 = vRefined->nSize / 3 + 99;
    while( true ) {
      do {
        nTableSize = uVar10 + 1;
        uVar5 = uVar10 & 1;
        uVar10 = nTableSize;
      } while (uVar5 != 0);
      if (nTableSize < 9) break;
      iVar8 = 5;
      while (nTableSize % (iVar8 - 2U) != 0) {
        uVar5 = iVar8 * iVar8;
        iVar8 = iVar8 + 2;
        if (nTableSize < uVar5) goto LAB_005c34b3;
      }
    }
LAB_005c34b3:
    __ptr = calloc((long)(int)nTableSize,4);
    if (0 < vRefined->nSize) {
      lVar11 = 0;
      do {
        iVar8 = vRefined->pArray[lVar11];
        puVar2 = p->pMems;
        iVar7 = p->pSimInfo[iVar8];
        nWords = p->nWords;
        iVar6 = Cec_ManSimCompareConst(puVar2 + (long)iVar7 + 1,nWords);
        if (iVar6 != 0) {
          __assert_fail("!Cec_ManSimCompareConst( pSim, p->nWords )",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                        ,0x1de,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
        }
        iVar7 = Cec_ManSimHashKey(puVar2 + (long)iVar7 + 1,nWords,nTableSize);
        uVar10 = *(uint *)((long)__ptr + (long)iVar7 * 4);
        lVar9 = (long)(int)uVar10;
        pGVar3 = p->pAig;
        if (lVar9 == 0) {
          GVar1 = pGVar3->pReprs[iVar8];
          if (((uint)GVar1 & 0xfffffff) != 0) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x1e2,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
          if (pGVar3->pNexts[iVar8] != 0) {
            __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x1e3,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
          pGVar3->pReprs[iVar8] = (Gia_Rpr_t)((uint)GVar1 | 0xfffffff);
        }
        else {
          pGVar3->pNexts[lVar9] = iVar8;
          pGVar4 = pGVar3->pReprs;
          uVar5 = (uint)pGVar4[lVar9] & 0xfffffff;
          if ((uVar5 != 0xfffffff) && (iVar8 <= (int)uVar5)) {
LAB_005c36c9:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar4[iVar8] = (Gia_Rpr_t)((uint)pGVar4[iVar8] & 0xf0000000 | uVar5);
          pGVar4 = p->pAig->pReprs;
          GVar1 = pGVar4[iVar8];
          if ((~(uint)GVar1 & 0xfffffff) == 0) {
            if ((uVar10 != 0xfffffff) && (iVar8 <= (int)uVar10)) goto LAB_005c36c9;
            pGVar4[iVar8] = (Gia_Rpr_t)((uint)GVar1 & 0xf0000000 | uVar10 & 0xfffffff);
          }
          if (((uint)p->pAig->pReprs[iVar8] & 0xfffffff) == 0) {
            __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x1ec,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
        }
        *(int *)((long)__ptr + (long)iVar7 * 4) = iVar8;
        lVar11 = lVar11 + 1;
      } while (lVar11 < vRefined->nSize);
    }
    if (0 < vRefined->nSize) {
      lVar11 = 0;
      do {
        iVar8 = vRefined->pArray[lVar11];
        if (((~(uint)p->pAig->pReprs[iVar8] & 0xfffffff) == 0) && (0 < p->pAig->pNexts[iVar8])) {
          Cec_ManSimClassRefineOne(p,iVar8);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < vRefined->nSize);
    }
    if (0 < vRefined->nSize) {
      lVar11 = 0;
      do {
        Cec_ManSimSimDeref(p,vRefined->pArray[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < vRefined->nSize);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void Cec_ManSimProcessRefined( Cec_ManSim_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Cec_ObjSim( p, i );
        assert( !Cec_ManSimCompareConst( pSim, p->nWords ) );
        Key = Cec_ManSimHashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Cec_ManSimClassRefineOne( p, i );
    }
    Vec_IntForEachEntry( vRefined, i, k )
        Cec_ManSimSimDeref( p, i );
    ABC_FREE( pTable );
}